

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  size_t sVar5;
  char *local_a0;
  char *pathOutFile;
  FILE *sockfile;
  addrinfo *paStack_88;
  int sockfd;
  addrinfo *ai;
  addrinfo hints;
  URL_S *url;
  char *fullUrl;
  char *pcStack_38;
  int c;
  char *d_dir;
  char *p_port;
  FILE *out;
  FLAG_S flags;
  char **argv_local;
  int argc_local;
  
  fileName = *argv;
  bVar1 = 0;
  p_port = _stdout;
  d_dir = "80";
  pcStack_38 = (char *)malloc(0x400);
  while (iVar2 = __posix_getopt(argc,argv,"p:o:d:"), iVar2 != -1) {
    if (iVar2 == 100) {
      if (((char)(bVar1 << 6) < '\0') || ((char)(bVar1 << 5) < '\0')) {
        fprintf(_stderr,"USAGE:\t%s [-p PORT] [ -o FILE | -d DIR ] URL\n",fileName);
        exit(1);
      }
      bVar1 = bVar1 & 0xfb | (((char)(bVar1 << 5) >> 7) + 1U & 1) << 2;
      pcStack_38 = strdup(_optarg);
    }
    else if (iVar2 == 0x6f) {
      if (((char)(bVar1 << 6) < '\0') || ((char)(bVar1 << 5) < '\0')) {
        fprintf(_stderr,"USAGE:\t%s [-p PORT] [ -o FILE | -d DIR ] URL\n",fileName);
        exit(1);
      }
      bVar1 = bVar1 & 0xfd | (((char)(bVar1 << 6) >> 7) + 1U & 1) << 1;
      pcStack_38 = strdup(_optarg);
    }
    else {
      if (iVar2 != 0x70) {
        fprintf(_stderr,"USAGE:\t%s [-p PORT] [ -o FILE | -d DIR ] URL\n",fileName);
        exit(1);
      }
      if ((char)(bVar1 << 7) < '\0') {
        fprintf(_stderr,"USAGE:\t%s [-p PORT] [ -o FILE | -d DIR ] URL\n",fileName);
        exit(1);
      }
      bVar1 = bVar1 & 0xfe | ((char)(bVar1 << 7) >> 7) + 1U & 1;
      d_dir = strdup(_optarg);
      iVar2 = isValidPort(d_dir);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s ERROR: ",fileName);
        fprintf(_stderr,"INVALID PORT");
        fprintf(_stderr,"\n");
        exit(1);
      }
    }
  }
  if (argv[_optind] == (char *)0x0) {
    fprintf(_stderr,"USAGE:\t%s [-p PORT] [ -o FILE | -d DIR ] URL\n",fileName);
    exit(1);
  }
  hints.ai_next = (addrinfo *)URL(argv[_optind]);
  memset(&ai,0,0x30);
  ai._4_4_ = 2;
  hints.ai_flags = 1;
  iVar2 = getaddrinfo(*(char **)hints.ai_next,d_dir,(addrinfo *)&ai,&stack0xffffffffffffff78);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s ERROR: ",fileName);
    fprintf(_stderr,"getaddrinfo");
    fprintf(_stderr,"\n");
    exit(1);
  }
  iVar2 = socket(paStack_88->ai_family,paStack_88->ai_socktype,paStack_88->ai_protocol);
  if (iVar2 < 0) {
    fprintf(_stderr,"%s ERROR: ",fileName);
    fprintf(_stderr,"socket");
    fprintf(_stderr,"\n");
    exit(1);
  }
  iVar3 = connect(iVar2,paStack_88->ai_addr,paStack_88->ai_addrlen);
  if (-1 < iVar3) {
    __stream = fdopen(iVar2,"r+");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s ERROR: ",fileName);
      fprintf(_stderr,"fdopen");
      fprintf(_stderr,"\n");
      exit(1);
    }
    printHeader((FILE *)__stream,(URL_S *)hints.ai_next);
    checkResponseHeader((FILE *)__stream);
    if (((char)(bVar1 << 6) < '\0') || ((char)(bVar1 << 5) < '\0')) {
      if ((char)(bVar1 << 5) < '\0') {
        sVar4 = strlen(pcStack_38);
        sVar5 = strlen(*(char **)&(hints.ai_next)->ai_socktype);
        local_a0 = (char *)malloc(sVar4 + 2 + sVar5);
        strcpy(local_a0,pcStack_38);
        strcat(local_a0,"/");
        strcat(local_a0,*(char **)&(hints.ai_next)->ai_socktype);
      }
      else {
        sVar4 = strlen(pcStack_38);
        local_a0 = (char *)malloc(sVar4 + 1);
        strcpy(local_a0,pcStack_38);
      }
      p_port = (char *)fopen(local_a0,"w");
      free(local_a0);
      free(pcStack_38);
      if ((FILE *)p_port == (FILE *)0x0) {
        fprintf(_stderr,"%s ERROR: ",fileName);
        fprintf(_stderr,"Could not open File");
        fprintf(_stderr,"\n");
        exit(1);
      }
    }
    goToEndOfHeader((FILE *)__stream);
    writeFileToFile((FILE *)__stream,(FILE *)p_port);
    fflush((FILE *)p_port);
    fclose((FILE *)p_port);
    free_URL(hints.ai_next);
    fclose(__stream);
    return 0;
  }
  fprintf(_stderr,"%s ERROR: ",fileName);
  fprintf(_stderr,"connection");
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
	fileName = argv[0];
	FLAG_S flags = {0,0,0};
	FILE * out = stdout;
	char* p_port = "80";
	char *d_dir= malloc(sizeof(char)*CHARLENGTH);

	int c;
	while ((c= getopt(argc, argv, "p:o:d:")) != -1) {
		switch (c) {
		case 'p':
			if (flags.p_flag) { USAGE(); }
				 flags.p_flag++; 
				 p_port = strdup(optarg);
				 if (isValidPort(p_port) == 0) {
					 ERROR_EXIT("INVALID PORT");
				 }
				 break;
		case 'o':
			if (flags.o_flag || flags.d_flag) { USAGE(); }
				flags.o_flag++; 
				d_dir = strdup(optarg);
				break;
		case 'd':
			if(flags.o_flag || flags.d_flag) { USAGE(); }
				flags.d_flag++; 
				d_dir = strdup(optarg);
				break;
		default:
			USAGE();
		}
	}
	
	
	char * fullUrl;
	if ((fullUrl=argv[optind]) == NULL) {
		USAGE();
	}
	URL_S *url = URL(fullUrl);


	struct addrinfo hints, *ai;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // create Internet Protocol (IP) socket
	hints.ai_socktype = SOCK_STREAM; // use TCP as transport protocol

	if (getaddrinfo(url->url, p_port, &hints, &ai) != 0) {ERROR_EXIT("getaddrinfo");}

	int sockfd;
	if ((sockfd = socket(ai->ai_family, ai->ai_socktype, ai->ai_protocol)) < 0) { ERROR_EXIT("socket"); }

	if ((connect(sockfd, ai->ai_addr, ai->ai_addrlen)) < 0)
		ERROR_EXIT("connection");

	FILE *sockfile = fdopen(sockfd, "r+");
	if (sockfile == NULL)
		ERROR_EXIT("fdopen");


	printHeader(sockfile,url);
	checkResponseHeader(sockfile);


	
	if (flags.o_flag || flags.d_flag) {
		char * pathOutFile;
		if (flags.d_flag) {
			pathOutFile = malloc((strlen(d_dir) + 2 + strlen(url->file)) * sizeof(char));
			strcpy(pathOutFile,d_dir);
			strcat(pathOutFile, "/");
			strcat(pathOutFile, url->file);
		} else{
			pathOutFile = malloc((strlen(d_dir) + 1) * sizeof(char));
			strcpy(pathOutFile,d_dir);
		}
		out = fopen(pathOutFile, "w");
		free(pathOutFile);
		free(d_dir);
		if (out == NULL) {ERROR_EXIT("Could not open File"); }
	}
	
	
	goToEndOfHeader(sockfile);
	writeFileToFile(sockfile,out);
	fflush(out);
	fclose(out);
	free_URL(url);
	fclose(sockfile);
	return 0;
}